

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

Aig_ManCut_t * Aig_ManCutStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fTruth,int fVerbose)

{
  Aig_ManCut_t *pAVar1;
  Aig_Cut_t **ppAVar2;
  Aig_MmFixed_t *pAVar3;
  uint *puVar4;
  byte bVar5;
  int iVar6;
  char *__assertion;
  uint uVar7;
  
  if (nCutsMax < 2) {
    __assertion = "nCutsMax >= 2";
    uVar7 = 0x31;
  }
  else {
    if (nLeafMax < 0x11) {
      pAVar1 = (Aig_ManCut_t *)calloc(1,0x50);
      pAVar1->nCutsMax = nCutsMax;
      pAVar1->nLeafMax = nLeafMax;
      pAVar1->fTruth = fTruth;
      pAVar1->fVerbose = fVerbose;
      pAVar1->pAig = pMan;
      ppAVar2 = (Aig_Cut_t **)calloc((long)pMan->vObjs->nSize,8);
      pAVar1->pCuts = ppAVar2;
      bVar5 = (char)nLeafMax - 5;
      uVar7 = 1 << (bVar5 & 0x1f);
      if (nLeafMax < 6) {
        uVar7 = 1;
      }
      if (nLeafMax < 6) {
        bVar5 = 0;
      }
      pAVar1->nTruthWords = uVar7;
      iVar6 = (fTruth * 4 << (bVar5 & 0x1f)) + nLeafMax * 4 + 0x18;
      pAVar1->nCutSize = iVar6;
      pAVar3 = Aig_MmFixedStart(iVar6 * nCutsMax,0x200);
      pAVar1->pMemCuts = pAVar3;
      if (fTruth != 0) {
        puVar4 = (uint *)malloc((ulong)(uVar7 * 4) << 2);
        pAVar1->puTemp[0] = puVar4;
        puVar4 = puVar4 + uVar7;
        pAVar1->puTemp[1] = puVar4;
        pAVar1->puTemp[2] = puVar4 + uVar7;
        pAVar1->puTemp[3] = puVar4 + uVar7 + uVar7;
      }
      return pAVar1;
    }
    __assertion = "nLeafMax <= 16";
    uVar7 = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                ,uVar7,"Aig_ManCut_t *Aig_ManCutStart(Aig_Man_t *, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_ManCut_t * Aig_ManCutStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fTruth, int fVerbose )
{
    Aig_ManCut_t * p;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Aig_ManCut_t, 1 );
    memset( p, 0, sizeof(Aig_ManCut_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fTruth   = fTruth;
    p->fVerbose = fVerbose;
    p->pAig     = pMan;
    p->pCuts    = ABC_CALLOC( Aig_Cut_t *, Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Aig_Cut_t) + sizeof(int) * nLeafMax + fTruth * sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // room for temporary truth tables
    if ( fTruth )
    {
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    return p;
}